

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *
vkt::wsi::anon_unknown_0::createDisplay
          (MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *__return_storage_ptr__,
          Platform *platform,Extensions *supportedExtensions,Type wsiType)

{
  int iVar1;
  NotSupportedError *e;
  Type local_24;
  Extensions *pEStack_20;
  Type wsiType_local;
  Extensions *supportedExtensions_local;
  Platform *platform_local;
  
  local_24 = wsiType;
  pEStack_20 = supportedExtensions;
  supportedExtensions_local = (Extensions *)platform;
  platform_local = (Platform *)__return_storage_ptr__;
  iVar1 = (*platform->_vptr_Platform[1])(platform,(ulong)wsiType);
  de::DefaultDeleter<vk::wsi::Display>::DefaultDeleter
            ((DefaultDeleter<vk::wsi::Display> *)((long)&e + 3));
  de::details::MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::MovePtr
            (__return_storage_ptr__,iVar1);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Display> createDisplay (const vk::Platform&	platform,
								const Extensions&	supportedExtensions,
								Type				wsiType)
{
	try
	{
		return MovePtr<Display>(platform.createWsiDisplay(wsiType));
	}
	catch (const tcu::NotSupportedError& e)
	{
		if (isExtensionSupported(supportedExtensions, RequiredExtension(getExtensionName(wsiType))))
		{
			// If VK_KHR_{platform}_surface was supported, vk::Platform implementation
			// must support creating native display & window for that WSI type.
			throw tcu::TestError(e.getMessage());
		}
		else
			throw;
	}
}